

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDFObjectHandle::arrayOrStreamToStreamArray
          (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__return_storage_ptr__,
          QPDFObjectHandle *this,string *description,string *all_description)

{
  pointer pQVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  int n;
  QPDF *pQVar5;
  pointer pQVar6;
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *local_1b0;
  QPDFObjectHandle local_1a8;
  string *local_198;
  string *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  Array array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  element_type *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_a0 [7];
  
  local_198 = description;
  local_190 = all_description;
  std::__cxx11::string::_M_assign((string *)all_description);
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0 = (vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)__return_storage_ptr__;
  as_array(&array,this,strict);
  if (array.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    bVar3 = isStream(this);
    if (bVar3) {
      std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
      emplace_back<QPDFObjectHandle&>(local_1b0,this);
    }
    else {
      bVar3 = isNull(this);
      if (!bVar3) {
        peVar2 = (this->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 == (element_type *)0x0) {
          pQVar5 = (QPDF *)0x0;
        }
        else {
          pQVar5 = peVar2->qpdf;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"",(allocator<char> *)&local_110);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,
                   " object is supposed to be a stream or an array of streams but is neither",
                   (allocator<char> *)&local_130);
        QPDFExc::QPDFExc((QPDFExc *)local_b0,qpdf_e_damaged_pdf,&local_168,local_198,0,&local_188);
        warn(pQVar5,(QPDFExc *)local_b0);
        QPDFExc::~QPDFExc((QPDFExc *)local_b0);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_168);
      }
    }
  }
  else {
    iVar4 = ::qpdf::Array::size(&array);
    n = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != n; n = n + 1) {
      ::qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_b0,&array,n);
      local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_a8;
      local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aaStack_a0[0]._0_8_;
      local_a8 = (element_type *)0x0;
      aaStack_a0[0]._M_allocated_capacity = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aaStack_a0[0]._M_allocated_capacity)
      ;
      bVar3 = isStream(&local_1a8);
      if (bVar3) {
        std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
        emplace_back<QPDFObjectHandle&>(local_1b0,&local_1a8);
      }
      else {
        if (local_1a8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
           ) {
          pQVar5 = (QPDF *)0x0;
        }
        else {
          pQVar5 = (local_1a8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qpdf;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_1b1);
        std::operator+(&local_130,local_198,": item index ");
        std::__cxx11::to_string(&local_d0,n);
        std::operator+(&local_110,&local_130,&local_d0);
        std::operator+(&local_188,&local_110," (from 0)");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"ignoring non-stream in an array of streams",&local_1b2);
        QPDFExc::QPDFExc((QPDFExc *)local_b0,qpdf_e_damaged_pdf,&local_168,&local_188,0,&local_f0);
        warn(pQVar5,(QPDFExc *)local_b0);
        QPDFExc::~QPDFExc((QPDFExc *)local_b0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_168);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1a8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  ::qpdf::Array::~Array(&array);
  pQVar1 = *(pointer *)(local_1b0 + 8);
  bVar3 = true;
  for (pQVar6 = *(pointer *)local_1b0; pQVar6 != pQVar1; pQVar6 = pQVar6 + 1) {
    if (!bVar3) {
      std::__cxx11::string::append((char *)local_190);
    }
    peVar2 = (pQVar6->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      local_188._M_dataplus._M_p._0_4_ = 0;
      local_188._M_dataplus._M_p._4_4_ = 0;
    }
    else {
      local_188._M_dataplus._M_p = *(pointer *)&peVar2->og;
    }
    QPDFObjGen::unparse_abi_cxx11_(&local_168,(QPDFObjGen *)&local_188,' ');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   " stream ",&local_168);
    std::__cxx11::string::append((string *)local_190);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&local_168);
    bVar3 = false;
  }
  return (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_1b0;
}

Assistant:

std::vector<QPDFObjectHandle>
QPDFObjectHandle::arrayOrStreamToStreamArray(
    std::string const& description, std::string& all_description)
{
    all_description = description;
    std::vector<QPDFObjectHandle> result;
    if (auto array = as_array(strict)) {
        int n_items = array.size();
        for (int i = 0; i < n_items; ++i) {
            QPDFObjectHandle item = array.at(i).second;
            if (item.isStream()) {
                result.emplace_back(item);
            } else {
                QTC::TC("qpdf", "QPDFObjectHandle non-stream in stream array");
                warn(
                    item.getOwningQPDF(),
                    QPDFExc(
                        qpdf_e_damaged_pdf,
                        "",
                        description + ": item index " + std::to_string(i) + " (from 0)",
                        0,
                        "ignoring non-stream in an array of streams"));
            }
        }
    } else if (isStream()) {
        result.emplace_back(*this);
    } else if (!isNull()) {
        warn(
            getOwningQPDF(),
            QPDFExc(
                qpdf_e_damaged_pdf,
                "",
                description,
                0,
                " object is supposed to be a stream or an array of streams but is neither"));
    }

    bool first = true;
    for (auto const& item: result) {
        if (first) {
            first = false;
        } else {
            all_description += ",";
        }
        all_description += " stream " + item.getObjGen().unparse(' ');
    }

    return result;
}